

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O3

string * __thiscall
PvrLegacyHeader::ToCsvString_abi_cxx11_(string *__return_storage_ptr__,PvrLegacyHeader *this)

{
  pointer pcVar1;
  pointer pbVar2;
  __string_type __str;
  undefined1 *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  ToStringArray_abi_cxx11_(&local_48,this);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar2 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar2->_M_dataplus)._M_p;
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + pbVar2->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_68,local_60,0,'\x01');
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string ToCsvString() {
    std::string output("");
    const auto& variable_strings(this->ToStringArray());
    for(const auto& variable_string:variable_strings)
      output.append(variable_string + ',');
    return output;
  }